

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

double fasttext::getArgGauss<double>
                 (double val,minstd_rand *rng,double startSigma,double endSigma,double t,bool linear
                 )

{
  undefined1 auVar1 [16];
  undefined7 in_register_00000031;
  result_type_conflict __x;
  double dVar2;
  undefined1 auVar3 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar4 [16];
  normal_distribution<double> normal;
  normal_distribution<double> local_28;
  
  local_28._M_param._M_mean = 0.0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = t + -0.25;
  auVar4 = vmaxsd_avx(ZEXT816(0),auVar4);
  auVar4 = vminsd_avx(auVar4,ZEXT816(0x3fe0000000000000));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (startSigma - endSigma) * -2.0;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = startSigma;
  auVar4 = vfmadd213sd_fma(auVar3,auVar4,auVar1);
  local_28._M_param._M_stddev = auVar4._0_8_;
  local_28._M_saved = 0.0;
  local_28._M_saved_available = false;
  __x = std::normal_distribution<double>::operator()(&local_28,rng);
  if ((int)CONCAT71(in_register_00000031,linear) == 0) {
    dVar2 = exp2(__x);
    dVar2 = dVar2 * val;
  }
  else {
    dVar2 = __x + val;
  }
  return dVar2;
}

Assistant:

T getArgGauss(
    T val,
    std::minstd_rand& rng,
    double startSigma,
    double endSigma,
    double t,
    bool linear) {
  T returnValue;
  const double stddev = startSigma -
      ((startSigma - endSigma) / 0.5) *
          std::min(0.5, std::max((t - 0.25), 0.0));

  std::normal_distribution<double> normal(0.0, stddev);

  const double coeff = normal(rng);
  double updateCoeff = 0.0;

  if (linear) {
    updateCoeff = coeff;
    returnValue = static_cast<T>(updateCoeff + val);
  } else {
    updateCoeff = std::pow(2.0, coeff);
    returnValue = static_cast<T>(updateCoeff * val);
  }

  return returnValue;
}